

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dtoa.cc
# Opt level: O0

void TestDtoaSign(void)

{
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  Vector<char> buffer_08;
  Vector<char> buffer_09;
  Vector<char> buffer_10;
  Vector<char> buffer_11;
  Vector<char> buffer_12;
  Vector<char> buffer_13;
  Vector<char> buffer_14;
  Vector<char> buffer_15;
  int point;
  int length;
  bool sign;
  Vector<char> buffer;
  char buffer_container [100];
  char *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  int line;
  char *in_stack_fffffffffffffe80;
  int *in_stack_fffffffffffffe98;
  int *length_00;
  bool *in_stack_fffffffffffffea0;
  bool *sign_00;
  undefined8 in_stack_fffffffffffffea8;
  int *piVar1;
  double in_stack_fffffffffffffeb0;
  bool *v;
  char *in_stack_fffffffffffffeb8;
  int *piVar2;
  undefined8 in_stack_fffffffffffffec0;
  bool *pbVar3;
  int *in_stack_fffffffffffffed0;
  bool *point_00;
  undefined1 local_84 [12];
  undefined1 local_78 [16];
  char local_68 [104];
  
  line = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  double_conversion::Vector<char>::Vector((Vector<char> *)local_78,local_68,100);
  buffer_00._8_8_ = in_stack_fffffffffffffec0;
  buffer_00.start_ = in_stack_fffffffffffffeb8;
  DoubleToAscii(in_stack_fffffffffffffeb0,(DtoaMode)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                (int)in_stack_fffffffffffffea8,buffer_00,in_stack_fffffffffffffea0,
                in_stack_fffffffffffffe98,in_stack_fffffffffffffed0);
  CheckHelper(in_stack_fffffffffffffe80,line,in_stack_fffffffffffffe70,
              SUB81((ulong)local_84 >> 0x38,0));
  buffer_01._8_8_ = in_stack_fffffffffffffec0;
  buffer_01.start_ = in_stack_fffffffffffffeb8;
  DoubleToAscii(in_stack_fffffffffffffeb0,(DtoaMode)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                (int)in_stack_fffffffffffffea8,buffer_01,in_stack_fffffffffffffea0,
                in_stack_fffffffffffffe98,in_stack_fffffffffffffed0);
  CheckHelper(in_stack_fffffffffffffe80,line,in_stack_fffffffffffffe70,
              SUB81((ulong)local_84 >> 0x38,0));
  buffer_02._8_8_ = in_stack_fffffffffffffec0;
  buffer_02.start_ = in_stack_fffffffffffffeb8;
  DoubleToAscii(in_stack_fffffffffffffeb0,(DtoaMode)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                (int)in_stack_fffffffffffffea8,buffer_02,in_stack_fffffffffffffea0,
                in_stack_fffffffffffffe98,in_stack_fffffffffffffed0);
  CheckHelper(in_stack_fffffffffffffe80,line,in_stack_fffffffffffffe70,
              SUB81((ulong)local_84 >> 0x38,0));
  buffer_03._8_8_ = in_stack_fffffffffffffec0;
  buffer_03.start_ = in_stack_fffffffffffffeb8;
  DoubleToAscii(in_stack_fffffffffffffeb0,(DtoaMode)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                (int)in_stack_fffffffffffffea8,buffer_03,in_stack_fffffffffffffea0,
                in_stack_fffffffffffffe98,in_stack_fffffffffffffed0);
  CheckHelper(in_stack_fffffffffffffe80,line,in_stack_fffffffffffffe70,
              SUB81((ulong)local_84 >> 0x38,0));
  buffer_04._8_8_ = in_stack_fffffffffffffec0;
  buffer_04.start_ = in_stack_fffffffffffffeb8;
  DoubleToAscii(in_stack_fffffffffffffeb0,(DtoaMode)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                (int)in_stack_fffffffffffffea8,buffer_04,in_stack_fffffffffffffea0,
                in_stack_fffffffffffffe98,in_stack_fffffffffffffed0);
  CheckHelper(in_stack_fffffffffffffe80,line,in_stack_fffffffffffffe70,
              SUB81((ulong)local_84 >> 0x38,0));
  buffer_05._8_8_ = in_stack_fffffffffffffec0;
  buffer_05.start_ = in_stack_fffffffffffffeb8;
  DoubleToAscii(in_stack_fffffffffffffeb0,(DtoaMode)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                (int)in_stack_fffffffffffffea8,buffer_05,in_stack_fffffffffffffea0,
                in_stack_fffffffffffffe98,in_stack_fffffffffffffed0);
  CheckHelper(in_stack_fffffffffffffe80,line,in_stack_fffffffffffffe70,
              SUB81((ulong)local_84 >> 0x38,0));
  buffer_06._8_8_ = in_stack_fffffffffffffec0;
  buffer_06.start_ = in_stack_fffffffffffffeb8;
  DoubleToAscii(in_stack_fffffffffffffeb0,(DtoaMode)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                (int)in_stack_fffffffffffffea8,buffer_06,in_stack_fffffffffffffea0,
                in_stack_fffffffffffffe98,in_stack_fffffffffffffed0);
  CheckHelper(in_stack_fffffffffffffe80,line,in_stack_fffffffffffffe70,
              SUB81((ulong)local_84 >> 0x38,0));
  buffer_07._8_8_ = in_stack_fffffffffffffec0;
  buffer_07.start_ = in_stack_fffffffffffffeb8;
  DoubleToAscii(in_stack_fffffffffffffeb0,(DtoaMode)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                (int)in_stack_fffffffffffffea8,buffer_07,in_stack_fffffffffffffea0,
                in_stack_fffffffffffffe98,in_stack_fffffffffffffed0);
  CheckHelper(in_stack_fffffffffffffe80,line,in_stack_fffffffffffffe70,
              SUB81((ulong)local_84 >> 0x38,0));
  buffer_08._8_8_ = in_stack_fffffffffffffec0;
  buffer_08.start_ = in_stack_fffffffffffffeb8;
  DoubleToAscii(in_stack_fffffffffffffeb0,(DtoaMode)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                (int)in_stack_fffffffffffffea8,buffer_08,in_stack_fffffffffffffea0,
                in_stack_fffffffffffffe98,in_stack_fffffffffffffed0);
  CheckHelper(in_stack_fffffffffffffe80,line,in_stack_fffffffffffffe70,
              SUB81((ulong)local_84 >> 0x38,0));
  buffer_09._8_8_ = in_stack_fffffffffffffec0;
  buffer_09.start_ = in_stack_fffffffffffffeb8;
  DoubleToAscii(in_stack_fffffffffffffeb0,(DtoaMode)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                (int)in_stack_fffffffffffffea8,buffer_09,in_stack_fffffffffffffea0,
                in_stack_fffffffffffffe98,in_stack_fffffffffffffed0);
  CheckHelper(in_stack_fffffffffffffe80,line,in_stack_fffffffffffffe70,
              SUB81((ulong)local_84 >> 0x38,0));
  buffer_10._8_8_ = in_stack_fffffffffffffec0;
  buffer_10.start_ = in_stack_fffffffffffffeb8;
  point_00 = (bool *)local_78._8_8_;
  DoubleToAscii(in_stack_fffffffffffffeb0,(DtoaMode)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                (int)in_stack_fffffffffffffea8,buffer_10,in_stack_fffffffffffffea0,
                in_stack_fffffffffffffe98,(int *)local_78._8_8_);
  CheckHelper(in_stack_fffffffffffffe80,line,in_stack_fffffffffffffe70,
              SUB81((ulong)local_84 >> 0x38,0));
  buffer_11._8_8_ = local_78._8_8_;
  buffer_11.start_ = (char *)local_78._0_8_;
  piVar2 = (int *)local_78._0_8_;
  pbVar3 = (bool *)local_78._8_8_;
  DoubleToAscii(in_stack_fffffffffffffeb0,(DtoaMode)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                (int)in_stack_fffffffffffffea8,buffer_11,in_stack_fffffffffffffea0,
                in_stack_fffffffffffffe98,(int *)point_00);
  CheckHelper(in_stack_fffffffffffffe80,line,in_stack_fffffffffffffe70,
              SUB81((ulong)local_84 >> 0x38,0));
  buffer_12._8_8_ = pbVar3;
  buffer_12.start_ = (char *)piVar2;
  piVar1 = (int *)local_78._0_8_;
  v = (bool *)local_78._8_8_;
  DoubleToAscii((double)local_78._8_8_,SUB84(local_78._0_8_,4),(int)local_78._0_8_,buffer_12,
                in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,(int *)point_00);
  CheckHelper(in_stack_fffffffffffffe80,line,in_stack_fffffffffffffe70,
              SUB81((ulong)local_84 >> 0x38,0));
  buffer_13._8_8_ = pbVar3;
  buffer_13.start_ = (char *)piVar2;
  length_00 = (int *)local_78._0_8_;
  sign_00 = (bool *)local_78._8_8_;
  DoubleToAscii((double)v,(DtoaMode)((ulong)piVar1 >> 0x20),(int)piVar1,buffer_13,
                (bool *)local_78._8_8_,(int *)local_78._0_8_,(int *)point_00);
  CheckHelper(in_stack_fffffffffffffe80,line,in_stack_fffffffffffffe70,
              SUB81((ulong)local_84 >> 0x38,0));
  buffer_14._8_8_ = pbVar3;
  buffer_14.start_ = (char *)piVar2;
  DoubleToAscii((double)v,(DtoaMode)((ulong)piVar1 >> 0x20),(int)piVar1,buffer_14,sign_00,length_00,
                (int *)point_00);
  CheckHelper(in_stack_fffffffffffffe80,line,in_stack_fffffffffffffe70,
              SUB81((ulong)local_84 >> 0x38,0));
  buffer_15._8_8_ = pbVar3;
  buffer_15.start_ = (char *)piVar2;
  DoubleToAscii((double)v,(DtoaMode)((ulong)piVar1 >> 0x20),(int)piVar1,buffer_15,sign_00,length_00,
                (int *)point_00);
  CheckHelper((char *)local_78._8_8_,local_78._4_4_,in_stack_fffffffffffffe70,
              SUB81((ulong)local_84 >> 0x38,0));
  return;
}

Assistant:

TEST(DtoaSign) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  bool sign;
  int length;
  int point;

  DoubleToAscii(0.0, SHORTEST, 0, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-0.0, SHORTEST, 0, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(1.0, SHORTEST, 0, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-1.0, SHORTEST, 0, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(0.0f, SHORTEST_SINGLE, 0, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-0.0f, SHORTEST_SINGLE, 0, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(1.0f, SHORTEST_SINGLE, 0, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-1.0f, SHORTEST_SINGLE, 0, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(0.0, PRECISION, 1, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-0.0, PRECISION, 1, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(1.0, PRECISION, 1, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-1.0, PRECISION, 1, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(0.0, FIXED, 1, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-0.0, FIXED, 1, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(1.0, FIXED, 1, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-1.0, FIXED, 1, buffer, &sign, &length, &point);
  CHECK(sign);
}